

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportInstallFileGenerator.cxx
# Opt level: O1

void __thiscall
cmExportInstallFileGenerator::SetImportLocationProperty
          (cmExportInstallFileGenerator *this,string *config,string *suffix,
          cmInstallTargetGenerator *itgen,ImportPropertyMap *properties,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *importedLocations)

{
  cmGeneratorTarget *this_00;
  undefined8 uVar1;
  bool bVar2;
  TargetType TVar3;
  mapped_type *pmVar4;
  string *obj;
  pointer this_01;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_01;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_02;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_03;
  string prop;
  string value;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  objects;
  string importValue;
  string dest;
  string local_118;
  pointer local_f8;
  string *local_f0;
  string local_e8;
  char *local_c8;
  char *local_c0;
  char local_b8;
  undefined7 uStack_b7;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *local_a8;
  ImportPropertyMap *local_a0;
  undefined1 local_98 [40];
  string local_70;
  string local_50;
  
  if (itgen == (cmInstallTargetGenerator *)0x0) {
    return;
  }
  bVar2 = cmInstallGenerator::InstallsForConfig(&itgen->super_cmInstallGenerator,config);
  if (!bVar2) {
    return;
  }
  this_00 = itgen->Target;
  local_a8 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)importedLocations;
  local_a0 = properties;
  cmInstallTargetGenerator::GetDestination(&local_50,itgen,config);
  local_c8 = &local_b8;
  local_c0 = (char *)0x0;
  local_b8 = '\0';
  bVar2 = cmsys::SystemTools::FileIsFullPath(&local_50);
  if (!bVar2) {
    std::__cxx11::string::_M_replace((ulong)&local_c8,0,local_c0,0x869faf);
  }
  std::__cxx11::string::_M_append((char *)&local_c8,(ulong)local_50._M_dataplus._M_p);
  std::__cxx11::string::append((char *)&local_c8);
  if (itgen->ImportLibrary == true) {
    local_118._M_dataplus._M_p = (char *)0xf;
    local_118._M_string_length = 0x840ddc;
    local_118.field_2._M_allocated_capacity = 0;
    local_f8 = (pointer)(suffix->_M_dataplus)._M_p;
    local_118.field_2._8_8_ = suffix->_M_string_length;
    local_f0 = (string *)0x0;
    views._M_len = 2;
    views._M_array = (iterator)&local_118;
    cmCatViews(&local_e8,views);
    cmInstallTargetGenerator::GetInstallFilename(&local_118,this_00,config,NameImplibReal);
    std::__cxx11::string::_M_append((char *)&local_c8,(ulong)local_118._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](local_a0,&local_e8);
    std::__cxx11::string::_M_assign((string *)pmVar4);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string_const&>(local_a8,&local_e8);
    goto LAB_005e7fab;
  }
  TVar3 = cmGeneratorTarget::GetType(itgen->Target);
  if (TVar3 == OBJECT_LIBRARY) {
    local_118._M_dataplus._M_p = (char *)0x10;
    local_118._M_string_length = 0x84082d;
    local_118.field_2._M_allocated_capacity = 0;
    local_f8 = (pointer)(suffix->_M_dataplus)._M_p;
    local_118.field_2._8_8_ = suffix->_M_string_length;
    local_f0 = (string *)0x0;
    views_00._M_len = 2;
    views_00._M_array = (iterator)&local_118;
    cmCatViews(&local_e8,views_00);
    local_98._0_8_ = (pointer)0x0;
    local_98._8_8_ = (pointer)0x0;
    local_98._16_8_ = (pointer)0x0;
    cmInstallTargetGenerator::GetInstallObjectNames
              (itgen,config,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_98);
    uVar1 = local_98._8_8_;
    if (local_98._0_8_ != local_98._8_8_) {
      this_01 = (pointer)local_98._0_8_;
      do {
        local_118._M_dataplus._M_p = local_c0;
        local_118._M_string_length = (size_type)local_c8;
        local_118.field_2._M_allocated_capacity = 0;
        local_f8 = (pointer)(this_01->_M_dataplus)._M_p;
        local_118.field_2._8_8_ = this_01->_M_string_length;
        local_f0 = (string *)0x0;
        views_01._M_len = 2;
        views_01._M_array = (iterator)&local_118;
        cmCatViews(&local_70,views_01);
        std::__cxx11::string::operator=((string *)this_01,(string *)&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        this_01 = this_01 + 1;
      } while (this_01 != (pointer)uVar1);
    }
    cmList::
    to_string<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0>
              (&local_118,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_98);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](local_a0,&local_e8);
    std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_118);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string_const&>(local_a8,&local_e8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_98);
    goto LAB_005e7fab;
  }
  bVar2 = cmGeneratorTarget::IsFrameworkOnApple(this_00);
  if ((bVar2) && (bVar2 = cmGeneratorTarget::HasImportLibrary(this_00,config), bVar2)) {
    cmStrCat<char_const(&)[16],std::__cxx11::string_const&>
              (&local_e8,(char (*) [16])0x840ddc,suffix);
    cmInstallTargetGenerator::GetInstallFilename((string *)local_98,this_00,config,NameImplibReal);
    local_118._M_dataplus._M_p = local_c0;
    local_118._M_string_length = (size_type)local_c8;
    local_118.field_2._M_allocated_capacity = 0;
    local_118.field_2._8_8_ = local_98._8_8_;
    local_f8 = (pointer)local_98._0_8_;
    views_02._M_len = 2;
    views_02._M_array = (iterator)&local_118;
    local_f0 = (string *)local_98;
    cmCatViews(&local_70,views_02);
    if ((pointer)local_98._0_8_ != (pointer)(local_98 + 0x10)) {
      operator_delete((void *)local_98._0_8_,(ulong)(local_98._16_8_ + 1));
    }
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](local_a0,&local_e8);
    std::__cxx11::string::_M_assign((string *)pmVar4);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string_const&>(local_a8,&local_e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
  }
  local_118._M_dataplus._M_p = &DAT_00000011;
  local_118._M_string_length = 0x839ff0;
  local_118.field_2._M_allocated_capacity = 0;
  local_f8 = (pointer)(suffix->_M_dataplus)._M_p;
  local_118.field_2._8_8_ = suffix->_M_string_length;
  local_f0 = (string *)0x0;
  views_03._M_len = 2;
  views_03._M_array = (iterator)&local_118;
  cmCatViews(&local_e8,views_03);
  bVar2 = cmGeneratorTarget::IsAppBundleOnApple(this_00);
  if (bVar2) {
    cmInstallTargetGenerator::GetInstallFilename(&local_118,this_00,config,NameNormal);
    std::__cxx11::string::_M_append((char *)&local_c8,(ulong)local_118._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)&local_c8);
    bVar2 = cmMakefile::PlatformIsAppleEmbedded(this_00->Makefile);
    if (!bVar2) {
      std::__cxx11::string::append((char *)&local_c8);
    }
    cmInstallTargetGenerator::GetInstallFilename(&local_118,this_00,config,NameNormal);
    std::__cxx11::string::_M_append((char *)&local_c8,(ulong)local_118._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
LAB_005e7f73:
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    cmInstallTargetGenerator::GetInstallFilename(&local_118,this_00,config,NameReal);
    std::__cxx11::string::_M_append((char *)&local_c8,(ulong)local_118._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) goto LAB_005e7f73;
  }
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](local_a0,&local_e8);
  std::__cxx11::string::_M_assign((string *)pmVar4);
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string_const&>(local_a8,&local_e8);
LAB_005e7fab:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  if (local_c8 != &local_b8) {
    operator_delete(local_c8,CONCAT71(uStack_b7,local_b8) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmExportInstallFileGenerator::SetImportLocationProperty(
  const std::string& config, std::string const& suffix,
  cmInstallTargetGenerator* itgen, ImportPropertyMap& properties,
  std::set<std::string>& importedLocations)
{
  // Skip rules that do not match this configuration.
  if (!(itgen && itgen->InstallsForConfig(config))) {
    return;
  }

  // Get the target to be installed.
  cmGeneratorTarget* target = itgen->GetTarget();

  // Construct the installed location of the target.
  std::string dest = itgen->GetDestination(config);
  std::string value;
  if (!cmSystemTools::FileIsFullPath(dest)) {
    // The target is installed relative to the installation prefix.
    value = "${_IMPORT_PREFIX}/";
  }
  value += dest;
  value += "/";

  if (itgen->IsImportLibrary()) {
    // Construct the property name.
    std::string prop = cmStrCat("IMPORTED_IMPLIB", suffix);

    // Append the installed file name.
    value += cmInstallTargetGenerator::GetInstallFilename(
      target, config, cmInstallTargetGenerator::NameImplibReal);

    // Store the property.
    properties[prop] = value;
    importedLocations.insert(prop);
  } else if (itgen->GetTarget()->GetType() == cmStateEnums::OBJECT_LIBRARY) {
    // Construct the property name.
    std::string prop = cmStrCat("IMPORTED_OBJECTS", suffix);

    // Compute all the object files inside this target and setup
    // IMPORTED_OBJECTS as a list of object files
    std::vector<std::string> objects;
    itgen->GetInstallObjectNames(config, objects);
    for (std::string& obj : objects) {
      obj = cmStrCat(value, obj);
    }

    // Store the property.
    properties[prop] = cmList::to_string(objects);
    importedLocations.insert(prop);
  } else {
    if (target->IsFrameworkOnApple() && target->HasImportLibrary(config)) {
      // store as well IMPLIB value
      auto importProp = cmStrCat("IMPORTED_IMPLIB", suffix);
      auto importValue =
        cmStrCat(value,
                 cmInstallTargetGenerator::GetInstallFilename(
                   target, config, cmInstallTargetGenerator::NameImplibReal));

      // Store the property.
      properties[importProp] = importValue;
      importedLocations.insert(importProp);
    }

    // Construct the property name.
    std::string prop = cmStrCat("IMPORTED_LOCATION", suffix);

    // Append the installed file name.
    if (target->IsAppBundleOnApple()) {
      value += cmInstallTargetGenerator::GetInstallFilename(target, config);
      value += ".app/";
      if (!target->Makefile->PlatformIsAppleEmbedded()) {
        value += "Contents/MacOS/";
      }
      value += cmInstallTargetGenerator::GetInstallFilename(target, config);
    } else {
      value += cmInstallTargetGenerator::GetInstallFilename(
        target, config, cmInstallTargetGenerator::NameReal);
    }

    // Store the property.
    properties[prop] = value;
    importedLocations.insert(prop);
  }
}